

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btAxisSweep3.h
# Opt level: O0

void __thiscall
btAxisSweep3Internal<unsigned_short>::~btAxisSweep3Internal
          (btAxisSweep3Internal<unsigned_short> *this)

{
  btBroadphaseInterface *in_RDI;
  int i;
  int local_c;
  
  in_RDI->_vptr_btBroadphaseInterface = (_func_int **)&PTR__btAxisSweep3Internal_002e1980;
  if (in_RDI[0x13]._vptr_btBroadphaseInterface != (_func_int **)0x0) {
    (**(code **)*in_RDI[0x14]._vptr_btBroadphaseInterface)();
    btAlignedFreeInternal((void *)0x159300);
    (**(code **)*in_RDI[0x13]._vptr_btBroadphaseInterface)();
    btAlignedFreeInternal((void *)0x159327);
  }
  for (local_c = 2; -1 < local_c; local_c = local_c + -1) {
    btAlignedFreeInternal((void *)0x15934e);
  }
  if (in_RDI[8]._vptr_btBroadphaseInterface != (_func_int **)0x0) {
    Handle::operator_delete__((void *)0x15937d);
  }
  if (((ulong)in_RDI[0x12]._vptr_btBroadphaseInterface & 1) != 0) {
    (**(code **)*in_RDI[0x10]._vptr_btBroadphaseInterface)();
    btAlignedFreeInternal((void *)0x1593b0);
  }
  btBroadphaseInterface::~btBroadphaseInterface(in_RDI);
  return;
}

Assistant:

btAxisSweep3Internal<BP_FP_INT_TYPE>::~btAxisSweep3Internal()
{
	if (m_raycastAccelerator)
	{
		m_nullPairCache->~btOverlappingPairCache();
		btAlignedFree(m_nullPairCache);
		m_raycastAccelerator->~btDbvtBroadphase();
		btAlignedFree (m_raycastAccelerator);
	}

	for (int i = 2; i >= 0; i--)
	{
		btAlignedFree(m_pEdgesRawPtr[i]);
	}
	delete [] m_pHandles;

	if (m_ownsPairCache)
	{
		m_pairCache->~btOverlappingPairCache();
		btAlignedFree(m_pairCache);
	}
}